

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_1::computeBinaryAtomicOperationResult
              (AtomicOperation op,int a,int b)

{
  switch(op) {
  case ATOMIC_OPERATION_ADD:
    return b + a;
  case ATOMIC_OPERATION_MIN:
    if (a < b) {
      b = a;
    }
    return b;
  case ATOMIC_OPERATION_MAX:
    if (b < a) {
      b = a;
    }
    return b;
  case ATOMIC_OPERATION_AND:
    return b & a;
  case ATOMIC_OPERATION_OR:
    return b | a;
  case ATOMIC_OPERATION_XOR:
    return b ^ a;
  case ATOMIC_OPERATION_EXCHANGE:
    break;
  default:
    b = -1;
  }
  return b;
}

Assistant:

int computeBinaryAtomicOperationResult (AtomicOperation op, int a, int b)
{
	switch (op)
	{
		case ATOMIC_OPERATION_ADD:			return a + b;
		case ATOMIC_OPERATION_MIN:			return de::min(a, b);
		case ATOMIC_OPERATION_MAX:			return de::max(a, b);
		case ATOMIC_OPERATION_AND:			return a & b;
		case ATOMIC_OPERATION_OR:			return a | b;
		case ATOMIC_OPERATION_XOR:			return a ^ b;
		case ATOMIC_OPERATION_EXCHANGE:		return b;
		default:
			DE_ASSERT(false);
			return -1;
	}
}